

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int send_client_hello(ptls_t *tls,ptls_message_emitter_t *emitter,
                     ptls_handshake_properties_t *properties,ptls_iovec_t *cookie)

{
  uint8_t *puVar1;
  st_ptls_esni_secret_t **esni;
  byte bVar2;
  uint16_t uVar3;
  ushort uVar4;
  ptls_key_schedule_t *ppVar5;
  ptls_context_t *ppVar6;
  st_ptls_update_esni_key_t *psVar7;
  size_t *psVar8;
  st_ptls_key_exchange_algorithm_t *psVar9;
  ptls_iovec_t *ppVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ptls_iovec_t hash_value;
  ptls_iovec_t pVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  st_ptls_esni_secret_t *psVar18;
  ptls_cipher_suite_t **pppVar19;
  ptls_hash_context_t *ppVar20;
  ptls_key_schedule_t *ppVar21;
  ptls_buffer_t *ppVar22;
  ptls_key_schedule_t *ppVar23;
  uint64_t uVar24;
  ulong uVar25;
  ptls_cipher_suite_t *ppVar26;
  size_t sVar27;
  ptls_key_exchange_algorithm_t *ppVar28;
  long lVar29;
  ptls_buffer_t *ppVar30;
  ulong uVar31;
  ptls_key_exchange_algorithm_t **pppVar32;
  uint16_t in_R8W;
  ptls_hash_algorithm_t *ppVar33;
  ptls_cipher_suite_t *in_R9;
  uint16_t in_R10W;
  ushort *puVar34;
  ptls_hash_context_t **pppVar35;
  ptls_buffer_t *ppVar36;
  size_t sVar37;
  int ret;
  ptls_buffer_t *ppVar38;
  size_t sVar39;
  uint8_t *puVar40;
  ptls_early_data_acceptance_t pVar41;
  size_t sVar42;
  bool bVar43;
  bool bVar44;
  ptls_iovec_t secret;
  ptls_iovec_t ikm;
  ptls_iovec_t esni_keys;
  uint32_t _v;
  uint64_t not_after;
  uint32_t max_early_data_size;
  uint32_t age_add;
  ptls_iovec_t resumption_ticket;
  uint32_t lifetime;
  uint8_t binder_key [64];
  ptls_buffer_t *in_stack_fffffffffffffec8;
  ptls_buffer_t *local_f8;
  ptls_buffer_t *local_f0;
  size_t sStack_e8;
  ptls_handshake_properties_t *local_e0;
  st_ptls_message_emitter_t *local_d8;
  size_t local_d0;
  size_t local_c8;
  ptls_buffer_t *local_c0;
  ptls_iovec_t *local_b8;
  char *local_b0;
  size_t local_a8;
  uint8_t *local_a0;
  uint local_98;
  uint32_t local_94;
  ptls_iovec_t local_90;
  uint32_t local_7c;
  ptls_iovec_t local_78 [4];
  
  ppVar5 = tls->key_schedule;
  local_b8 = cookie;
  if (tls->server_name == (char *)0x0) {
    local_d0 = 0;
  }
  else {
    iVar15 = ptls_server_name_is_ipaddr(tls->server_name);
    local_d0 = CONCAT71((int7)((ulong)cookie >> 8),iVar15 == 0);
  }
  if (properties == (ptls_handshake_properties_t *)0x0) {
    uVar16 = 0;
    uVar25 = 0;
    local_f8 = (ptls_buffer_t *)0x0;
  }
  else {
    if (((ppVar5 == (ptls_key_schedule_t *)0x0 & (byte)local_d0) == 1) &&
       (ppVar36 = (ptls_buffer_t *)(properties->field_0).client.esni_keys.base,
       ppVar36 != (ptls_buffer_t *)0x0)) {
      ppVar6 = tls->ctx;
      sVar42 = (properties->field_0).client.esni_keys.len;
      local_e0 = properties;
      psVar18 = (st_ptls_esni_secret_t *)malloc(200);
      tls->esni = psVar18;
      if (psVar18 == (st_ptls_esni_secret_t *)0x0) {
        iVar15 = 0x201;
      }
      else {
        memset(psVar18,0,200);
        in_R9 = (ptls_cipher_suite_t *)0x32;
        local_f0 = ppVar36;
        if ((1 < (long)sVar42) &&
           (local_f0 = (ptls_buffer_t *)((long)&ppVar36->base + 2),
           (ushort)(*(ushort *)&ppVar36->base << 8 | *(ushort *)&ppVar36->base >> 8) == 0xff01)) {
          local_c8 = sVar42;
          if ((long)sVar42 < 6) {
            bVar44 = false;
          }
          else {
            pppVar19 = ppVar6->cipher_suites;
            ppVar26 = *pppVar19;
            if (ppVar26 == (ptls_cipher_suite_t *)0x0) {
              ppVar20 = (st_ptls_hash_context_t *)0x0;
            }
            else {
              ppVar20 = (st_ptls_hash_context_t *)0x0;
              do {
                pppVar19 = pppVar19 + 1;
                if ((ppVar26->id | 2) == 0x1303) {
                  ppVar20 = (*ppVar26->hash->create)();
                  break;
                }
                ppVar26 = *pppVar19;
              } while (ppVar26 != (ptls_cipher_suite_t *)0x0);
            }
            if (ppVar20 == (st_ptls_hash_context_t *)0x0) {
              in_R9 = (ptls_cipher_suite_t *)0x203;
              bVar44 = false;
            }
            else {
              (*ppVar20->update)(ppVar20,ppVar36,2);
              (*ppVar20->update)(ppVar20,"",4);
              local_c0 = (ptls_buffer_t *)((long)&ppVar36->base + 6);
              (*ppVar20->update)(ppVar20,local_c0,local_c8 - 6);
              bVar44 = false;
              (*ppVar20->final)(ppVar20,local_78,PTLS_HASH_FINAL_MODE_FREE);
              in_R9 = (ptls_cipher_suite_t *)0x32;
              if (*(int *)((long)&ppVar36->base + 2) == (int)local_78[0].base) {
                local_f0 = local_c0;
                bVar44 = true;
                in_R9 = (ptls_cipher_suite_t *)0x0;
              }
            }
          }
          sVar42 = local_c8;
          if (bVar44) {
            ppVar38 = (ptls_buffer_t *)((long)&ppVar36->base + local_c8);
            in_R9 = (ptls_cipher_suite_t *)0x32;
            if ((ulong)((long)ppVar38 - (long)local_f0) < 2) {
              ppVar26 = (ptls_cipher_suite_t *)0x0;
            }
            else {
              lVar29 = 0;
              uVar25 = 0;
              do {
                uVar25 = (ulong)*(byte *)((long)&local_f0->base + lVar29) | uVar25 << 8;
                lVar29 = lVar29 + 1;
              } while (lVar29 != 2);
              local_f0 = (ptls_buffer_t *)((long)&local_f0->base + 2);
              ppVar26 = (ptls_cipher_suite_t *)0x0;
              if (uVar25 <= (ulong)((long)ppVar38 - (long)local_f0)) {
                ppVar30 = (ptls_buffer_t *)((long)&local_f0->base + uVar25);
                ppVar22 = ppVar30;
                uVar16 = select_key_share((ptls_key_exchange_algorithm_t **)&psVar18->field_3,
                                          local_78,ppVar6->key_exchanges,(uint8_t **)&local_f0,
                                          (uint8_t *)ppVar30,0);
                in_R8W = (uint16_t)ppVar22;
                in_R9 = (ptls_cipher_suite_t *)0x32;
                if (local_f0 == ppVar30) {
                  in_R9 = ppVar26;
                }
                if (uVar16 != 0) {
                  in_R9 = (ptls_cipher_suite_t *)(ulong)uVar16;
                }
                ppVar26 = (ptls_cipher_suite_t *)(ulong)(uVar16 == 0 && local_f0 == ppVar30);
              }
            }
            sVar42 = local_c8;
            if ((char)ppVar26 != '\0') {
              in_R9 = (ptls_cipher_suite_t *)0x32;
              if ((ulong)((long)ppVar38 - (long)local_f0) < 2) {
                bVar44 = false;
              }
              else {
                lVar29 = 0;
                uVar25 = 0;
                do {
                  uVar25 = (ulong)*(byte *)((long)&local_f0->base + lVar29) | uVar25 << 8;
                  lVar29 = lVar29 + 1;
                } while (lVar29 != 2);
                local_f0 = (ptls_buffer_t *)((long)&local_f0->base + 2);
                if ((ulong)((long)ppVar38 - (long)local_f0) < uVar25) {
                  bVar44 = false;
                }
                else {
                  ppVar22 = (ptls_buffer_t *)((long)&local_f0->base + uVar25);
                  uVar16 = select_cipher(&(psVar18->field_3).client.cipher,ppVar6->cipher_suites,
                                         (uint8_t *)local_f0,(uint8_t *)ppVar22);
                  in_R9 = (ptls_cipher_suite_t *)0x0;
                  if (uVar16 == 0) {
                    bVar44 = true;
                    local_f0 = ppVar22;
                  }
                  else {
                    bVar44 = false;
                    in_R9 = (ptls_cipher_suite_t *)(ulong)uVar16;
                  }
                }
              }
              if ((bVar44) &&
                 (in_R9 = (ptls_cipher_suite_t *)0x32, 1 < (long)ppVar38 - (long)local_f0)) {
                (psVar18->field_3).client.padded_length =
                     *(ushort *)&local_f0->base << 8 | *(ushort *)&local_f0->base >> 8;
                local_f0 = (ptls_buffer_t *)((long)&local_f0->base + 2);
                uVar16 = ptls_decode64((uint64_t *)&local_90,(uint8_t **)&local_f0,
                                       (uint8_t *)ppVar38);
                if ((uVar16 == 0) &&
                   (uVar16 = ptls_decode64((uint64_t *)&local_a0,(uint8_t **)&local_f0,
                                           (uint8_t *)ppVar38), uVar16 == 0)) {
                  in_R9 = (ptls_cipher_suite_t *)0x32;
                  if ((ulong)((long)ppVar38 - (long)local_f0) < 2) {
                    bVar44 = false;
                  }
                  else {
                    lVar29 = 0;
                    uVar25 = 0;
                    do {
                      uVar25 = (ulong)*(byte *)((long)&local_f0->base + lVar29) | uVar25 << 8;
                      lVar29 = lVar29 + 1;
                    } while (lVar29 != 2);
                    local_f0 = (ptls_buffer_t *)((long)&local_f0->base + 2);
                    uVar16 = 0;
                    bVar44 = false;
                    if (uVar25 <= (ulong)((long)ppVar38 - (long)local_f0)) {
                      if (uVar25 == 0) {
                        bVar44 = true;
                      }
                      else {
                        ppVar30 = (ptls_buffer_t *)((long)&local_f0->base + uVar25);
                        ppVar22 = local_f0;
                        do {
                          uVar31 = (long)ppVar30 - (long)ppVar22;
                          uVar25 = (ulong)((uint)(1 < (long)uVar31) * 2);
                          local_f0 = (ptls_buffer_t *)((long)&ppVar22->base + uVar25);
                          bVar44 = true;
                          uVar16 = 0x32;
                          if ((long)uVar31 < 2) {
                            in_R8W = 0;
                          }
                          else {
                            uVar31 = (long)ppVar30 - (long)local_f0;
                            uVar16 = 0x32;
                            if (uVar31 < 2) {
                              in_R8W = 0;
                            }
                            else {
                              lVar29 = 0;
                              uVar31 = 0;
                              do {
                                uVar31 = (ulong)*(byte *)((long)&local_f0->base + lVar29) |
                                         uVar31 << 8;
                                lVar29 = lVar29 + 1;
                              } while (lVar29 != 2);
                              local_f0 = (ptls_buffer_t *)((long)&ppVar22->base + uVar25 + 2);
                              in_R8W = 0;
                              if (uVar31 <= (ulong)((long)ppVar30 - (long)local_f0)) {
                                local_f0 = (ptls_buffer_t *)((long)&local_f0->base + uVar31);
                                in_R8W = 1;
                                bVar44 = false;
                                uVar16 = 0;
                              }
                            }
                          }
                          in_R10W = (uint16_t)uVar31;
                          if ((char)in_R8W == '\0') goto LAB_0010a72d;
                          ppVar22 = local_f0;
                        } while (local_f0 != ppVar30);
                        bVar44 = false;
LAB_0010a72d:
                        bVar44 = !bVar44;
                      }
                      in_R9 = (ptls_cipher_suite_t *)(ulong)uVar16;
                      sVar42 = local_c8;
                    }
                  }
                  if ((bVar44) && (in_R9 = (ptls_cipher_suite_t *)0x32, local_f0 == ppVar38)) {
                    uVar24 = (*ppVar6->get_time->cb)(ppVar6->get_time);
                    uVar16 = 0;
                    if (local_a0 < (uint8_t *)(uVar24 / 1000)) {
                      uVar16 = 0x32;
                    }
                    if ((uint8_t *)(uVar24 / 1000) < local_90.base) {
                      uVar16 = 0x32;
                    }
                    in_R9 = (ptls_cipher_suite_t *)(ulong)uVar16;
                  }
                }
                else {
                  in_R9 = (ptls_cipher_suite_t *)(ulong)uVar16;
                }
              }
            }
          }
        }
        esni = &tls->esni;
        if ((int)in_R9 == 0) {
          local_d8 = emitter;
          (*ppVar6->random_bytes)((*esni)->nonce,0x10);
          psVar18 = *esni;
          ppVar20 = (*((psVar18->field_3).client.cipher)->hash->create)();
          if (ppVar20 == (ptls_hash_context_t *)0x0) {
            iVar15 = 0x201;
          }
          else {
            (*ppVar20->update)(ppVar20,ppVar36,sVar42);
            (*ppVar20->final)(ppVar20,(void *)((long)&psVar18->field_3 + 0x20),
                              PTLS_HASH_FINAL_MODE_FREE);
            psVar18 = *esni;
            psVar9 = (psVar18->field_3).client.key_share;
            pVar14.base._4_4_ = local_78[0].base._4_4_;
            pVar14.base._0_4_ = (int)local_78[0].base;
            pVar14.len = local_78[0].len;
            iVar15 = (*psVar9->exchange)(psVar9,&(psVar18->field_3).client.pubkey,&psVar18->secret,
                                         pVar14);
            in_R8W = (uint16_t)local_78[0].len;
            if (iVar15 == 0) {
              in_stack_fffffffffffffec8 = (ptls_buffer_t *)tls->client_random;
              psVar18 = *esni;
              ppVar10 = &(psVar18->field_3).client.pubkey;
              in_R8W = (uint16_t)ppVar10->base;
              in_R9 = (ptls_cipher_suite_t *)(psVar18->field_3).client.pubkey.len;
              iVar15 = build_esni_contents_hash
                                 (((psVar18->field_3).client.cipher)->hash,
                                  psVar18->esni_contents_hash,
                                  (psVar18->field_3).client.record_digest,
                                  ((psVar18->field_3).client.key_share)->id,*ppVar10,
                                  (uint8_t *)in_stack_fffffffffffffec8);
            }
          }
          emitter = local_d8;
          if (iVar15 != 0) {
            free_esni_secret(esni,0);
            emitter = local_d8;
          }
        }
        else {
          free(*esni);
          *esni = (st_ptls_esni_secret_t *)0x0;
          iVar15 = 0;
        }
      }
      properties = local_e0;
      if (iVar15 != 0) goto LAB_0010af5a;
      psVar7 = tls->ctx->update_esni_key;
      if (psVar7 != (st_ptls_update_esni_key_t *)0x0) {
        psVar18 = tls->esni;
        ppVar33 = ((psVar18->field_3).client.cipher)->hash;
        in_R9 = (ptls_cipher_suite_t *)psVar18->esni_contents_hash;
        iVar15 = (*psVar7->cb)(psVar7,tls,psVar18->secret,ppVar33,in_R9);
        in_R8W = (uint16_t)ppVar33;
        if (iVar15 != 0) goto LAB_0010af5a;
      }
    }
    ppVar36 = (ptls_buffer_t *)(properties->field_0).client.session_ticket.base;
    pVar41 = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
    if (ppVar36 == (ptls_buffer_t *)0x0) {
      uVar16 = 0;
      local_f8 = (ptls_buffer_t *)0x0;
      uVar25 = 0;
    }
    else {
      ppVar38 = (ptls_buffer_t *)
                ((long)&ppVar36->base + (properties->field_0).client.session_ticket.len);
      local_f0 = ppVar36;
      iVar15 = ptls_decode64((uint64_t *)&local_a0,(uint8_t **)&local_f0,(uint8_t *)ppVar38);
      local_e0 = properties;
      local_d8 = emitter;
      if (iVar15 == 0) {
        lVar29 = (long)ppVar38 - (long)local_f0;
        if (lVar29 < 2) {
          iVar15 = 0x32;
        }
        else {
          in_R10W = *(ushort *)&local_f0->base << 8 | *(ushort *)&local_f0->base >> 8;
          local_f0 = (ptls_buffer_t *)((long)&local_f0->base + 2);
          iVar15 = 0;
        }
        in_R9 = (ptls_cipher_suite_t *)0x0;
        ppVar28 = (ptls_key_exchange_algorithm_t *)0x0;
        uVar16 = 0;
        uVar31 = 0;
        ppVar36 = (ptls_buffer_t *)0x0;
        if (1 < lVar29) {
          lVar29 = (long)ppVar38 - (long)local_f0;
          if (lVar29 < 2) {
            iVar15 = 0x32;
          }
          else {
            in_R8W = *(ushort *)&local_f0->base << 8 | *(ushort *)&local_f0->base >> 8;
            local_f0 = (ptls_buffer_t *)((long)&local_f0->base + 2);
            iVar15 = 0;
          }
          in_R9 = (ptls_cipher_suite_t *)0x0;
          ppVar28 = (ptls_key_exchange_algorithm_t *)0x0;
          uVar16 = 0;
          uVar31 = 0;
          ppVar36 = (ptls_buffer_t *)0x0;
          if (1 < lVar29) {
            if ((ulong)((long)ppVar38 - (long)local_f0) < 3) {
LAB_00109c4d:
              bVar44 = false;
              iVar15 = 0x32;
              ppVar22 = local_f0;
            }
            else {
              lVar29 = 0;
              uVar25 = 0;
              do {
                uVar25 = (ulong)*(byte *)((long)&local_f0->base + lVar29) | uVar25 << 8;
                lVar29 = lVar29 + 1;
              } while (lVar29 != 3);
              ppVar36 = (ptls_buffer_t *)((long)&local_f0->base + 3);
              local_f0 = ppVar36;
              if ((ulong)((long)ppVar38 - (long)ppVar36) < uVar25) goto LAB_00109c4d;
              ppVar22 = (ptls_buffer_t *)((long)&ppVar36->base + uVar25);
              iVar17 = decode_new_session_ticket
                                 (tls,&local_7c,&local_94,local_78,&local_90,&local_98,
                                  (uint8_t *)ppVar36,(uint8_t *)ppVar22);
              iVar15 = 0;
              bVar44 = iVar17 == 0;
              in_stack_fffffffffffffec8 = ppVar36;
              if (!bVar44) {
                iVar15 = iVar17;
                ppVar22 = local_f0;
              }
            }
            local_f0 = ppVar22;
            in_R9 = (ptls_cipher_suite_t *)0x0;
            if (bVar44) {
              uVar16 = 0;
              if ((ulong)((long)ppVar38 - (long)local_f0) < 2) {
LAB_00109d03:
                uVar31 = 0;
                ppVar36 = (ptls_buffer_t *)0x0;
                bVar44 = false;
                iVar15 = 0x32;
              }
              else {
                lVar29 = 0;
                uVar31 = 0;
                do {
                  uVar31 = (ulong)*(byte *)((long)&local_f0->base + lVar29) | uVar31 << 8;
                  lVar29 = lVar29 + 1;
                } while (lVar29 != 2);
                ppVar36 = (ptls_buffer_t *)((long)&local_f0->base + 2);
                local_f0 = ppVar36;
                if ((ulong)((long)ppVar38 - (long)ppVar36) < uVar31) goto LAB_00109d03;
                local_f0 = (ptls_buffer_t *)((long)&ppVar36->base + uVar31);
                bVar44 = true;
              }
              if (bVar44) {
                if (local_f0 == ppVar38) {
                  ppVar6 = tls->ctx;
                  pppVar32 = ppVar6->key_exchanges;
                  ppVar28 = *pppVar32;
                  bVar44 = ppVar28 == (ptls_key_exchange_algorithm_t *)0x0;
                  if (bVar44) {
LAB_0010a04a:
                    ppVar28 = (ptls_key_exchange_algorithm_t *)0x0;
                    bVar44 = false;
                    iVar15 = 0x203;
                  }
                  else {
                    uVar3 = ppVar28->id;
                    while (uVar3 != in_R10W) {
                      pppVar32 = pppVar32 + 1;
                      ppVar28 = *pppVar32;
                      bVar44 = ppVar28 == (ptls_key_exchange_algorithm_t *)0x0;
                      if (bVar44) goto LAB_0010a04a;
                      uVar3 = ppVar28->id;
                    }
                    if (bVar44) goto LAB_0010a04a;
                    bVar44 = true;
                  }
                  if (!bVar44) {
                    uVar16 = 0;
                    in_R9 = (ptls_cipher_suite_t *)0x0;
                    goto LAB_00109d58;
                  }
                  pppVar19 = ppVar6->cipher_suites;
                  in_R9 = *pppVar19;
                  bVar44 = in_R9 == (ptls_cipher_suite_t *)0x0;
                  if (bVar44) {
LAB_0010a1de:
                    in_R9 = (ptls_cipher_suite_t *)0x0;
                    bVar44 = false;
                    iVar15 = 0x203;
                  }
                  else {
                    uVar3 = in_R9->id;
                    while (uVar3 != in_R8W) {
                      pppVar19 = pppVar19 + 1;
                      in_R9 = *pppVar19;
                      bVar44 = in_R9 == (ptls_cipher_suite_t *)0x0;
                      if (bVar44) goto LAB_0010a1de;
                      uVar3 = in_R9->id;
                    }
                    if (bVar44) goto LAB_0010a1de;
                    bVar44 = true;
                  }
                  if (bVar44) {
                    puVar40 = (uint8_t *)(*ppVar6->get_time->cb)(ppVar6->get_time);
                    if (puVar40 < local_a0) {
                      uVar16 = 0;
                      iVar15 = 0x32;
                    }
                    else {
                      if (0x240c83ff < (ulong)((long)puVar40 - (long)local_a0)) goto LAB_00109d43;
                      uVar16 = (int)((long)puVar40 - (long)local_a0) + local_94;
                      iVar15 = 0;
                    }
                  }
                  else {
                    uVar16 = 0;
                  }
                }
                else {
                  in_R9 = (ptls_cipher_suite_t *)0x0;
                  ppVar28 = (ptls_key_exchange_algorithm_t *)0x0;
LAB_00109d43:
                  uVar16 = 0;
                  iVar15 = 0x32;
                }
              }
              else {
                in_R9 = (ptls_cipher_suite_t *)0x0;
                ppVar28 = (ptls_key_exchange_algorithm_t *)0x0;
              }
            }
            else {
              ppVar28 = (ptls_key_exchange_algorithm_t *)0x0;
              uVar16 = 0;
              uVar31 = 0;
              ppVar36 = (ptls_buffer_t *)0x0;
            }
          }
        }
      }
      else {
        in_R9 = (ptls_cipher_suite_t *)0x0;
        ppVar28 = (ptls_key_exchange_algorithm_t *)0x0;
        uVar16 = 0;
        uVar31 = 0;
        ppVar36 = (ptls_buffer_t *)0x0;
      }
LAB_00109d58:
      local_f8 = (ptls_buffer_t *)0x0;
      emitter = local_d8;
      properties = local_e0;
      uVar25 = 0;
      if (iVar15 == 0) {
        bVar2 = (tls->field_20).server.pending_traffic_secret[0x28];
        (tls->field_20).server.pending_traffic_secret[0x28] = bVar2 | 1;
        if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
          tls->key_share = ppVar28;
        }
        tls->cipher_suite = in_R9;
        uVar25 = uVar31;
        local_f8 = ppVar36;
        if ((local_98 != 0 && ppVar5 == (ptls_key_schedule_t *)0x0) &&
           ((local_e0->field_0).client.max_early_data_size != (size_t *)0x0)) {
          (tls->field_20).server.pending_traffic_secret[0x28] = bVar2 | 3;
          *(local_e0->field_0).client.max_early_data_size = (ulong)local_98;
        }
      }
    }
    if (((tls->field_20).server.pending_traffic_secret[0x28] & 2) == 0) {
      psVar8 = (properties->field_0).client.max_early_data_size;
      pVar41 = PTLS_EARLY_DATA_REJECTED;
      if (psVar8 != (size_t *)0x0) {
        *psVar8 = 0;
      }
    }
    (properties->field_0).client.early_data_acceptance = pVar41;
  }
  if ((tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) &&
     ((properties == (ptls_handshake_properties_t *)0x0 ||
      (((properties->field_0).server.selected_psk_binder.base[0x2c] & 1) == 0)))) {
    tls->key_share = *tls->ctx->key_exchanges;
  }
  if (ppVar5 == (ptls_key_schedule_t *)0x0) {
    ppVar21 = key_schedule_new(tls->cipher_suite,tls->ctx->cipher_suites,
                               tls->ctx->hkdf_label_prefix__obsolete);
    tls->key_schedule = ppVar21;
    ikm.len = uVar25;
    ikm.base = (uint8_t *)local_f8;
    iVar15 = key_schedule_extract(ppVar21,ikm);
    if (iVar15 != 0) goto LAB_0010af5a;
  }
  sVar42 = emitter->record_header_length + emitter->buf->off;
  iVar15 = (*emitter->begin_message)(emitter);
  local_c8 = sVar42;
  if (iVar15 == 0) {
    ppVar36 = emitter->buf;
    iVar15 = ptls_buffer_reserve(ppVar36,1);
    if (iVar15 == 0) {
      ppVar36->base[ppVar36->off] = '\x01';
      ppVar36->off = ppVar36->off + 1;
      iVar15 = 0;
    }
    bVar44 = true;
    local_c0 = ppVar36;
    if (iVar15 == 0) {
      iVar15 = ptls_buffer_reserve(ppVar36,3);
      if (iVar15 == 0) {
        puVar40 = local_c0->base;
        sVar42 = local_c0->off;
        puVar40[sVar42 + 2] = '\0';
        puVar40 = puVar40 + sVar42;
        puVar40[0] = '\0';
        puVar40[1] = '\0';
        local_c0->off = local_c0->off + 3;
        iVar15 = 0;
      }
      if (iVar15 == 0) {
        sVar42 = local_c0->off;
        ppVar36 = emitter->buf;
        local_e0 = properties;
        iVar15 = ptls_buffer_reserve(ppVar36,2);
        if (iVar15 == 0) {
          puVar40 = ppVar36->base;
          sVar37 = ppVar36->off;
          (puVar40 + sVar37)[0] = '\x03';
          (puVar40 + sVar37)[1] = '\x03';
          ppVar36->off = ppVar36->off + 2;
          iVar15 = 0;
        }
        bVar44 = iVar15 != 0;
        if (iVar15 == 0) {
          iVar15 = ptls_buffer_reserve(ppVar36,0x20);
          if (iVar15 == 0) {
            puVar40 = ppVar36->base;
            sVar37 = ppVar36->off;
            uVar11 = *(undefined8 *)tls->client_random;
            uVar12 = *(undefined8 *)(tls->client_random + 8);
            uVar13 = *(undefined8 *)(tls->client_random + 0x18);
            puVar1 = puVar40 + sVar37 + 0x10;
            *(undefined8 *)puVar1 = *(undefined8 *)(tls->client_random + 0x10);
            *(undefined8 *)(puVar1 + 8) = uVar13;
            puVar40 = puVar40 + sVar37;
            *(undefined8 *)puVar40 = uVar11;
            *(undefined8 *)(puVar40 + 8) = uVar12;
            ppVar36->off = ppVar36->off + 0x20;
            iVar15 = 0;
          }
          bVar44 = true;
          if (iVar15 == 0) {
            iVar15 = ptls_buffer_reserve(ppVar36,1);
            if (iVar15 == 0) {
              ppVar36->base[ppVar36->off] = '\0';
              ppVar36->off = ppVar36->off + 1;
              iVar15 = 0;
            }
            bVar44 = true;
            if (iVar15 == 0) {
              sVar37 = ppVar36->off;
              iVar15 = ptls_buffer_reserve(ppVar36,0x20);
              if (iVar15 == 0) {
                puVar40 = ppVar36->base;
                sVar39 = ppVar36->off;
                uVar11 = *(undefined8 *)&tls->field_20;
                uVar12 = *(undefined8 *)((long)&tls->field_20 + 8);
                uVar13 = *(undefined8 *)((long)&tls->field_20 + 0x18);
                puVar1 = puVar40 + sVar39 + 0x10;
                *(undefined8 *)puVar1 = *(undefined8 *)((long)&tls->field_20 + 0x10);
                *(undefined8 *)(puVar1 + 8) = uVar13;
                puVar40 = puVar40 + sVar39;
                *(undefined8 *)puVar40 = uVar11;
                *(undefined8 *)(puVar40 + 8) = uVar12;
                ppVar36->off = ppVar36->off + 0x20;
                iVar15 = 0;
              }
              bVar43 = false;
              if (iVar15 == 0) {
                ppVar36->base[sVar37 - 1] = (char)(int)ppVar36->off - (char)sVar37;
                bVar43 = true;
                bVar44 = false;
              }
            }
            else {
              bVar43 = false;
            }
            if (bVar43) {
              iVar15 = ptls_buffer_reserve(ppVar36,2);
              if (iVar15 == 0) {
                puVar40 = ppVar36->base;
                sVar37 = ppVar36->off;
                (puVar40 + sVar37)[0] = '\0';
                (puVar40 + sVar37)[1] = '\0';
                ppVar36->off = ppVar36->off + 2;
                iVar15 = 0;
              }
              bVar44 = true;
              if (iVar15 == 0) {
                sVar37 = ppVar36->off;
                pppVar19 = tls->ctx->cipher_suites;
                ppVar26 = *pppVar19;
                bVar44 = false;
                local_d8 = emitter;
                if (ppVar26 == (ptls_cipher_suite_t *)0x0) {
                  bVar43 = true;
                  iVar15 = 0;
                }
                else {
                  do {
                    pppVar19 = pppVar19 + 1;
                    local_a8 = CONCAT62(local_a8._2_6_,ppVar26->id);
                    iVar15 = ptls_buffer_reserve(ppVar36,2);
                    if (iVar15 == 0) {
                      *(ushort *)(ppVar36->base + ppVar36->off) =
                           (ushort)local_a8 << 8 | (ushort)local_a8 >> 8;
                      ppVar36->off = ppVar36->off + 2;
                      iVar15 = 0;
                    }
                    bVar43 = iVar15 == 0;
                    if (!bVar43) {
                      bVar44 = true;
                      break;
                    }
                    ppVar26 = *pppVar19;
                  } while (ppVar26 != (ptls_cipher_suite_t *)0x0);
                }
                emitter = local_d8;
                if (bVar43) {
                  uVar25 = ppVar36->off - sVar37;
                  lVar29 = 8;
                  do {
                    ppVar36->base[sVar37 - 2] = (uint8_t)(uVar25 >> ((byte)lVar29 & 0x3f));
                    lVar29 = lVar29 + -8;
                    sVar37 = sVar37 + 1;
                  } while (lVar29 != -8);
                  bVar44 = false;
                }
              }
              if (!bVar44) {
                iVar15 = ptls_buffer_reserve(ppVar36,1);
                if (iVar15 == 0) {
                  ppVar36->base[ppVar36->off] = '\0';
                  ppVar36->off = ppVar36->off + 1;
                  iVar15 = 0;
                }
                bVar44 = true;
                if (iVar15 == 0) {
                  sVar37 = ppVar36->off;
                  iVar15 = ptls_buffer_reserve(ppVar36,1);
                  if (iVar15 == 0) {
                    ppVar36->base[ppVar36->off] = '\0';
                    ppVar36->off = ppVar36->off + 1;
                    iVar15 = 0;
                  }
                  bVar43 = false;
                  if (iVar15 == 0) {
                    ppVar36->base[sVar37 - 1] = (char)(int)ppVar36->off - (char)sVar37;
                    bVar43 = true;
                    bVar44 = false;
                  }
                }
                else {
                  bVar43 = false;
                }
                if (bVar43) {
                  iVar15 = ptls_buffer_reserve(ppVar36,2);
                  if (iVar15 == 0) {
                    puVar40 = ppVar36->base;
                    sVar37 = ppVar36->off;
                    (puVar40 + sVar37)[0] = '\0';
                    (puVar40 + sVar37)[1] = '\0';
                    ppVar36->off = ppVar36->off + 2;
                    iVar15 = 0;
                  }
                  bVar44 = true;
                  if (iVar15 == 0) {
                    local_a8 = ppVar36->off;
                    iVar15 = ptls_buffer_reserve(ppVar36,2);
                    if (iVar15 == 0) {
                      puVar40 = ppVar36->base;
                      sVar37 = ppVar36->off;
                      (puVar40 + sVar37)[0] = '\0';
                      (puVar40 + sVar37)[1] = '3';
                      ppVar36->off = ppVar36->off + 2;
                      iVar15 = 0;
                    }
                    bVar44 = iVar15 != 0;
                    local_d8 = emitter;
                    if (iVar15 == 0) {
                      iVar15 = ptls_buffer_reserve(ppVar36,2);
                      if (iVar15 == 0) {
                        puVar40 = ppVar36->base;
                        sVar37 = ppVar36->off;
                        (puVar40 + sVar37)[0] = '\0';
                        (puVar40 + sVar37)[1] = '\0';
                        ppVar36->off = ppVar36->off + 2;
                        iVar15 = 0;
                      }
                      if (iVar15 == 0) {
                        ppVar21 = (ptls_key_schedule_t *)ppVar36->off;
                        iVar15 = ptls_buffer_reserve(ppVar36,2);
                        if (iVar15 == 0) {
                          puVar40 = ppVar36->base;
                          sVar37 = ppVar36->off;
                          (puVar40 + sVar37)[0] = '\0';
                          (puVar40 + sVar37)[1] = '\0';
                          ppVar36->off = ppVar36->off + 2;
                          iVar15 = 0;
                        }
                        bVar44 = true;
                        if (iVar15 == 0) {
                          sVar37 = ppVar36->off;
                          psVar9 = tls->key_share;
                          if ((psVar9 != (st_ptls_key_exchange_algorithm_t *)0x0) &&
                             ((iVar15 = (*psVar9->create)(psVar9,&(tls->field_20).client.
                                                                  key_share_ctx), iVar15 != 0 ||
                              (iVar15 = push_key_share_entry
                                                  (ppVar36,tls->key_share->id,
                                                   ((tls->field_20).client.key_share_ctx)->pubkey),
                              iVar15 != 0)))) goto LAB_0010a5d5;
                          uVar25 = ppVar36->off - sVar37;
                          lVar29 = 8;
                          do {
                            ppVar36->base[sVar37 - 2] = (uint8_t)(uVar25 >> ((byte)lVar29 & 0x3f));
                            lVar29 = lVar29 + -8;
                            sVar37 = sVar37 + 1;
                          } while (lVar29 != -8);
                          bVar44 = false;
                          bVar43 = true;
                          iVar15 = 0;
                        }
                        else {
LAB_0010a5d5:
                          bVar43 = false;
                        }
                        if (bVar43) {
                          local_b0 = (char *)(ppVar36->off - (long)ppVar21);
                          lVar29 = 8;
                          ppVar23 = ppVar21;
                          do {
                            ppVar23->secret[(long)(ppVar36->base + -0x12)] =
                                 (uint8_t)((ulong)local_b0 >> ((byte)lVar29 & 0x3f));
                            lVar29 = lVar29 + -8;
                            ppVar23 = (ptls_key_schedule_t *)((long)&ppVar23->generation + 1);
                          } while (lVar29 != -8);
                          bVar44 = false;
                        }
                      }
                      else {
                        bVar44 = true;
                        ppVar21 = ppVar5;
                      }
                      if (!bVar44) {
                        if ((char)local_d0 == '\0') {
LAB_0010a844:
                          if ((local_e0 == (ptls_handshake_properties_t *)0x0) ||
                             ((local_e0->field_0).client.negotiated_protocols.count == 0)) {
LAB_0010aafd:
                            if (tls->ctx->decompress_certificate ==
                                (ptls_decompress_certificate_t *)0x0) {
LAB_0010acc6:
                              iVar15 = ptls_buffer_reserve(ppVar36,2);
                              if (iVar15 == 0) {
                                puVar40 = ppVar36->base;
                                sVar37 = ppVar36->off;
                                (puVar40 + sVar37)[0] = '\0';
                                (puVar40 + sVar37)[1] = '+';
                                ppVar36->off = ppVar36->off + 2;
                                iVar15 = 0;
                              }
                              bVar44 = iVar15 != 0;
                              if (!bVar44) {
                                iVar15 = ptls_buffer_reserve(ppVar36,2);
                                if (iVar15 == 0) {
                                  puVar40 = ppVar36->base;
                                  sVar37 = ppVar36->off;
                                  (puVar40 + sVar37)[0] = '\0';
                                  (puVar40 + sVar37)[1] = '\0';
                                  ppVar36->off = ppVar36->off + 2;
                                  iVar15 = 0;
                                }
                                bVar44 = true;
                                if (iVar15 == 0) {
                                  sVar37 = ppVar36->off;
                                  iVar15 = ptls_buffer_reserve(ppVar36,1);
                                  if (iVar15 == 0) {
                                    ppVar36->base[ppVar36->off] = '\0';
                                    ppVar36->off = ppVar36->off + 1;
                                    iVar15 = 0;
                                  }
                                  bVar44 = true;
                                  if (iVar15 == 0) {
                                    sVar39 = ppVar36->off;
                                    lVar29 = 0;
                                    do {
                                      uVar4 = *(ushort *)((long)supported_versions + lVar29);
                                      iVar15 = ptls_buffer_reserve(ppVar36,2);
                                      if (iVar15 == 0) {
                                        *(ushort *)(ppVar36->base + ppVar36->off) =
                                             uVar4 << 8 | uVar4 >> 8;
                                        ppVar36->off = ppVar36->off + 2;
                                        iVar15 = 0;
                                      }
                                      if (iVar15 != 0) {
                                        bVar44 = true;
                                        goto LAB_0010b0b0;
                                      }
                                      lVar29 = lVar29 + 2;
                                    } while (lVar29 != 8);
                                    bVar44 = false;
LAB_0010b0b0:
                                    if (iVar15 == 0) {
                                      ppVar36->base[sVar39 - 1] =
                                           (char)(int)ppVar36->off - (char)sVar39;
                                      bVar44 = false;
                                    }
                                  }
                                  if (!bVar44) {
                                    uVar25 = ppVar36->off - sVar37;
                                    lVar29 = 8;
                                    do {
                                      ppVar36->base[sVar37 - 2] =
                                           (uint8_t)(uVar25 >> ((byte)lVar29 & 0x3f));
                                      lVar29 = lVar29 + -8;
                                      sVar37 = sVar37 + 1;
                                    } while (lVar29 != -8);
                                    bVar44 = false;
                                  }
                                }
                                if (!bVar44) {
                                  iVar15 = ptls_buffer_reserve(ppVar36,2);
                                  if (iVar15 == 0) {
                                    puVar40 = ppVar36->base;
                                    sVar37 = ppVar36->off;
                                    (puVar40 + sVar37)[0] = '\0';
                                    (puVar40 + sVar37)[1] = '\r';
                                    ppVar36->off = ppVar36->off + 2;
                                    iVar15 = 0;
                                  }
                                  bVar44 = iVar15 != 0;
                                  if (!bVar44) {
                                    iVar15 = ptls_buffer_reserve(ppVar36,2);
                                    if (iVar15 == 0) {
                                      puVar40 = ppVar36->base;
                                      sVar37 = ppVar36->off;
                                      (puVar40 + sVar37)[0] = '\0';
                                      (puVar40 + sVar37)[1] = '\0';
                                      ppVar36->off = ppVar36->off + 2;
                                      iVar15 = 0;
                                    }
                                    bVar44 = true;
                                    if (iVar15 == 0) {
                                      sVar37 = ppVar36->off;
                                      iVar15 = push_signature_algorithms(ppVar36);
                                      if (iVar15 != 0) goto LAB_0010b1a2;
                                      uVar25 = ppVar36->off - sVar37;
                                      lVar29 = 8;
                                      do {
                                        ppVar36->base[sVar37 - 2] =
                                             (uint8_t)(uVar25 >> ((byte)lVar29 & 0x3f));
                                        lVar29 = lVar29 + -8;
                                        sVar37 = sVar37 + 1;
                                      } while (lVar29 != -8);
                                      bVar44 = false;
                                      bVar43 = true;
                                    }
                                    else {
LAB_0010b1a2:
                                      bVar43 = false;
                                    }
                                    if (bVar43) {
                                      iVar15 = ptls_buffer_reserve(ppVar36,2);
                                      if (iVar15 == 0) {
                                        puVar40 = ppVar36->base;
                                        sVar37 = ppVar36->off;
                                        (puVar40 + sVar37)[0] = '\0';
                                        (puVar40 + sVar37)[1] = '\n';
                                        ppVar36->off = ppVar36->off + 2;
                                        iVar15 = 0;
                                      }
                                      bVar44 = iVar15 != 0;
                                      if (!bVar44) {
                                        iVar15 = ptls_buffer_reserve(ppVar36,2);
                                        if (iVar15 == 0) {
                                          puVar40 = ppVar36->base;
                                          sVar37 = ppVar36->off;
                                          (puVar40 + sVar37)[0] = '\0';
                                          (puVar40 + sVar37)[1] = '\0';
                                          ppVar36->off = ppVar36->off + 2;
                                          iVar15 = 0;
                                        }
                                        bVar44 = true;
                                        if (iVar15 == 0) {
                                          sVar37 = ppVar36->off;
                                          pppVar32 = tls->ctx->key_exchanges;
                                          iVar15 = ptls_buffer_reserve(ppVar36,2);
                                          if (iVar15 == 0) {
                                            puVar40 = ppVar36->base;
                                            sVar39 = ppVar36->off;
                                            (puVar40 + sVar39)[0] = '\0';
                                            (puVar40 + sVar39)[1] = '\0';
                                            ppVar36->off = ppVar36->off + 2;
                                            iVar15 = 0;
                                          }
                                          bVar44 = true;
                                          if (iVar15 == 0) {
                                            sVar39 = ppVar36->off;
                                            ppVar28 = *pppVar32;
                                            iVar15 = 0;
                                            while (ppVar28 != (ptls_key_exchange_algorithm_t *)0x0)
                                            {
                                              pppVar32 = pppVar32 + 1;
                                              uVar25 = local_d0 >> 0x10;
                                              local_d0 = CONCAT62((int6)uVar25,ppVar28->id);
                                              iVar15 = ptls_buffer_reserve(ppVar36,2);
                                              if (iVar15 == 0) {
                                                *(ushort *)(ppVar36->base + ppVar36->off) =
                                                     (ushort)local_d0 << 8 | (ushort)local_d0 >> 8;
                                                ppVar36->off = ppVar36->off + 2;
                                                iVar15 = 0;
                                              }
                                              if (iVar15 != 0) {
                                                bVar43 = false;
                                                goto LAB_0010b37c;
                                              }
                                              ppVar28 = *pppVar32;
                                            }
                                            uVar25 = ppVar36->off - sVar39;
                                            lVar29 = 8;
                                            do {
                                              ppVar36->base[sVar39 - 2] =
                                                   (uint8_t)(uVar25 >> ((byte)lVar29 & 0x3f));
                                              lVar29 = lVar29 + -8;
                                              sVar39 = sVar39 + 1;
                                            } while (lVar29 != -8);
                                            bVar44 = false;
                                            bVar43 = true;
                                          }
                                          else {
                                            bVar43 = false;
                                          }
LAB_0010b37c:
                                          if (bVar43) {
                                            uVar25 = ppVar36->off - sVar37;
                                            lVar29 = 8;
                                            do {
                                              ppVar36->base[sVar37 - 2] =
                                                   (uint8_t)(uVar25 >> ((byte)lVar29 & 0x3f));
                                              lVar29 = lVar29 + -8;
                                              sVar37 = sVar37 + 1;
                                            } while (lVar29 != -8);
                                            bVar44 = false;
                                          }
                                        }
                                        if (!bVar44) {
                                          if ((local_b8 != (ptls_iovec_t *)0x0) &&
                                             (local_b8->base != (uint8_t *)0x0)) {
                                            iVar15 = ptls_buffer_reserve(ppVar36,2);
                                            if (iVar15 == 0) {
                                              puVar40 = ppVar36->base;
                                              sVar37 = ppVar36->off;
                                              (puVar40 + sVar37)[0] = '\0';
                                              (puVar40 + sVar37)[1] = ',';
                                              ppVar36->off = ppVar36->off + 2;
                                              iVar15 = 0;
                                            }
                                            bVar44 = iVar15 != 0;
                                            if (bVar44) goto LAB_0010ad10;
                                            iVar15 = ptls_buffer_reserve(ppVar36,2);
                                            if (iVar15 == 0) {
                                              puVar40 = ppVar36->base;
                                              sVar37 = ppVar36->off;
                                              (puVar40 + sVar37)[0] = '\0';
                                              (puVar40 + sVar37)[1] = '\0';
                                              ppVar36->off = ppVar36->off + 2;
                                              iVar15 = 0;
                                            }
                                            bVar44 = true;
                                            if (iVar15 == 0) {
                                              sVar37 = ppVar36->off;
                                              iVar15 = ptls_buffer_reserve(ppVar36,2);
                                              if (iVar15 == 0) {
                                                puVar40 = ppVar36->base;
                                                sVar39 = ppVar36->off;
                                                (puVar40 + sVar39)[0] = '\0';
                                                (puVar40 + sVar39)[1] = '\0';
                                                ppVar36->off = ppVar36->off + 2;
                                                iVar15 = 0;
                                              }
                                              bVar44 = true;
                                              if (iVar15 == 0) {
                                                sVar39 = ppVar36->off;
                                                iVar15 = ptls_buffer__do_pushv
                                                                   (ppVar36,local_b8->base,
                                                                    local_b8->len);
                                                if (iVar15 != 0) goto LAB_0010b4c7;
                                                uVar25 = ppVar36->off - sVar39;
                                                lVar29 = 8;
                                                do {
                                                  ppVar36->base[sVar39 - 2] =
                                                       (uint8_t)(uVar25 >> ((byte)lVar29 & 0x3f));
                                                  lVar29 = lVar29 + -8;
                                                  sVar39 = sVar39 + 1;
                                                } while (lVar29 != -8);
                                                bVar44 = false;
                                                bVar43 = true;
                                              }
                                              else {
LAB_0010b4c7:
                                                bVar43 = false;
                                              }
                                              if (bVar43) {
                                                uVar25 = ppVar36->off - sVar37;
                                                lVar29 = 8;
                                                do {
                                                  ppVar36->base[sVar37 - 2] =
                                                       (uint8_t)(uVar25 >> ((byte)lVar29 & 0x3f));
                                                  lVar29 = lVar29 + -8;
                                                  sVar37 = sVar37 + 1;
                                                } while (lVar29 != -8);
                                                bVar44 = false;
                                              }
                                            }
                                            if (bVar44) goto LAB_0010ad10;
                                          }
                                          iVar15 = push_additional_extensions(local_e0,ppVar36);
                                          bVar44 = true;
                                          if (iVar15 == 0) {
                                            iVar15 = 0;
                                            if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0
                                                && local_f8 == (ptls_buffer_t *)0x0) {
LAB_0010b64d:
                                              if (local_f8 == (ptls_buffer_t *)0x0) {
LAB_0010bb69:
                                                bVar44 = false;
                                              }
                                              else if (((tls->field_20).server.
                                                        pending_traffic_secret[0x28] & 2) == 0 ||
                                                       ppVar5 != (ptls_key_schedule_t *)0x0) {
LAB_0010b679:
                                                iVar15 = ptls_buffer_reserve(ppVar36,2);
                                                if (iVar15 == 0) {
                                                  puVar40 = ppVar36->base;
                                                  sVar37 = ppVar36->off;
                                                  (puVar40 + sVar37)[0] = '\0';
                                                  (puVar40 + sVar37)[1] = ')';
                                                  ppVar36->off = ppVar36->off + 2;
                                                  iVar15 = 0;
                                                }
                                                bVar44 = iVar15 != 0;
                                                if (!bVar44) {
                                                  iVar15 = ptls_buffer_reserve(ppVar36,2);
                                                  if (iVar15 == 0) {
                                                    puVar40 = ppVar36->base;
                                                    sVar37 = ppVar36->off;
                                                    (puVar40 + sVar37)[0] = '\0';
                                                    (puVar40 + sVar37)[1] = '\0';
                                                    ppVar36->off = ppVar36->off + 2;
                                                    iVar15 = 0;
                                                  }
                                                  bVar44 = true;
                                                  if (iVar15 == 0) {
                                                    local_e0 = (ptls_handshake_properties_t *)
                                                               ppVar36->off;
                                                    iVar15 = ptls_buffer_reserve(ppVar36,2);
                                                    if (iVar15 == 0) {
                                                      puVar40 = ppVar36->base;
                                                      sVar37 = ppVar36->off;
                                                      (puVar40 + sVar37)[0] = '\0';
                                                      (puVar40 + sVar37)[1] = '\0';
                                                      ppVar36->off = ppVar36->off + 2;
                                                      iVar15 = 0;
                                                    }
                                                    bVar44 = true;
                                                    if (iVar15 == 0) {
                                                      sVar37 = ppVar36->off;
                                                      iVar15 = ptls_buffer_reserve(ppVar36,2);
                                                      if (iVar15 == 0) {
                                                        puVar40 = ppVar36->base;
                                                        sVar39 = ppVar36->off;
                                                        (puVar40 + sVar39)[0] = '\0';
                                                        (puVar40 + sVar39)[1] = '\0';
                                                        ppVar36->off = ppVar36->off + 2;
                                                        iVar15 = 0;
                                                      }
                                                      bVar44 = true;
                                                      if (iVar15 == 0) {
                                                        sVar39 = ppVar36->off;
                                                        iVar15 = ptls_buffer__do_pushv
                                                                           (ppVar36,local_90.base,
                                                                            local_90.len);
                                                        if (iVar15 != 0) goto LAB_0010b7ac;
                                                        uVar25 = ppVar36->off - sVar39;
                                                        lVar29 = 8;
                                                        do {
                                                          ppVar36->base[sVar39 - 2] =
                                                               (uint8_t)(uVar25 >>
                                                                        ((byte)lVar29 & 0x3f));
                                                          lVar29 = lVar29 + -8;
                                                          sVar39 = sVar39 + 1;
                                                        } while (lVar29 != -8);
                                                        bVar44 = false;
                                                        bVar43 = true;
                                                      }
                                                      else {
LAB_0010b7ac:
                                                        bVar43 = false;
                                                      }
                                                      if (bVar43) {
                                                        iVar15 = ptls_buffer_reserve(ppVar36,4);
                                                        if (iVar15 == 0) {
                                                          *(uint *)(ppVar36->base + ppVar36->off) =
                                                               uVar16 >> 0x18 |
                                                               (uVar16 & 0xff0000) >> 8 |
                                                               (uVar16 & 0xff00) << 8 |
                                                               uVar16 << 0x18;
                                                          ppVar36->off = ppVar36->off + 4;
                                                          iVar15 = 0;
                                                        }
                                                        bVar44 = iVar15 != 0;
                                                        if (iVar15 == 0) {
                                                          uVar25 = ppVar36->off - sVar37;
                                                          lVar29 = 8;
                                                          do {
                                                            ppVar36->base[sVar37 - 2] =
                                                                 (uint8_t)(uVar25 >>
                                                                          ((byte)lVar29 & 0x3f));
                                                            lVar29 = lVar29 + -8;
                                                            sVar37 = sVar37 + 1;
                                                          } while (lVar29 != -8);
                                                          bVar44 = false;
                                                        }
                                                      }
                                                    }
                                                    if (!bVar44) {
                                                      iVar15 = ptls_buffer_reserve(ppVar36,2);
                                                      if (iVar15 == 0) {
                                                        puVar40 = ppVar36->base;
                                                        sVar37 = ppVar36->off;
                                                        (puVar40 + sVar37)[0] = '\0';
                                                        (puVar40 + sVar37)[1] = '\0';
                                                        ppVar36->off = ppVar36->off + 2;
                                                        iVar15 = 0;
                                                      }
                                                      bVar44 = true;
                                                      if (iVar15 == 0) {
                                                        sVar37 = ppVar36->off;
                                                        iVar15 = ptls_buffer_reserve(ppVar36,1);
                                                        if (iVar15 == 0) {
                                                          ppVar36->base[ppVar36->off] = '\0';
                                                          ppVar36->off = ppVar36->off + 1;
                                                          iVar15 = 0;
                                                        }
                                                        bVar44 = true;
                                                        if (iVar15 == 0) {
                                                          sVar39 = ppVar36->off;
                                                          iVar15 = ptls_buffer_reserve(ppVar36,(tls
                                                  ->key_schedule->hashes[0].algo)->digest_size);
                                                  bVar43 = false;
                                                  if (iVar15 == 0) {
                                                    sVar27 = ppVar36->off +
                                                             (tls->key_schedule->hashes[0].algo)->
                                                             digest_size;
                                                    ppVar36->off = sVar27;
                                                    ppVar36->base[sVar39 - 1] =
                                                         (char)sVar27 - (char)sVar39;
                                                    bVar43 = true;
                                                    bVar44 = false;
                                                  }
                                                  }
                                                  else {
                                                    bVar43 = false;
                                                  }
                                                  if (bVar43) {
                                                    uVar25 = ppVar36->off - sVar37;
                                                    lVar29 = 8;
                                                    do {
                                                      ppVar36->base[sVar37 - 2] =
                                                           (uint8_t)(uVar25 >> ((byte)lVar29 & 0x3f)
                                                                    );
                                                      lVar29 = lVar29 + -8;
                                                      sVar37 = sVar37 + 1;
                                                    } while (lVar29 != -8);
                                                    bVar44 = false;
                                                  }
                                                  }
                                                  if (!bVar44) {
                                                    uVar25 = ppVar36->off - (long)local_e0;
                                                    lVar29 = 8;
                                                    do {
                                                      (ppVar36->base + -2)[(long)local_e0] =
                                                           (uint8_t)(uVar25 >> ((byte)lVar29 & 0x3f)
                                                                    );
                                                      lVar29 = lVar29 + -8;
                                                      local_e0 = (ptls_handshake_properties_t *)
                                                                 ((long)&(local_e0->field_0).client.
                                                                         negotiated_protocols.list +
                                                                 1);
                                                    } while (lVar29 != -8);
                                                    goto LAB_0010bb69;
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                              else {
                                                iVar15 = ptls_buffer_reserve(ppVar36,2);
                                                if (iVar15 == 0) {
                                                  puVar40 = ppVar36->base;
                                                  sVar37 = ppVar36->off;
                                                  (puVar40 + sVar37)[0] = '\0';
                                                  (puVar40 + sVar37)[1] = '*';
                                                  ppVar36->off = ppVar36->off + 2;
                                                  iVar15 = 0;
                                                }
                                                bVar44 = iVar15 != 0;
                                                if (!bVar44) {
                                                  iVar15 = ptls_buffer_reserve(ppVar36,2);
                                                  if (iVar15 == 0) {
                                                    puVar40 = ppVar36->base;
                                                    sVar37 = ppVar36->off;
                                                    (puVar40 + sVar37)[0] = '\0';
                                                    (puVar40 + sVar37)[1] = '\0';
                                                    ppVar36->off = ppVar36->off + 2;
                                                    iVar15 = 0;
                                                  }
                                                  bVar44 = true;
                                                  if (iVar15 == 0) {
                                                    sVar37 = ppVar36->off;
                                                    lVar29 = -2;
                                                    do {
                                                      ppVar36->base[lVar29 + sVar37] = '\0';
                                                      lVar29 = lVar29 + 1;
                                                    } while (lVar29 != 0);
                                                    bVar44 = false;
                                                  }
                                                  if (iVar15 == 0) goto LAB_0010b679;
                                                }
                                              }
                                            }
                                            else {
                                              iVar15 = ptls_buffer_reserve(ppVar36,2);
                                              if (iVar15 == 0) {
                                                puVar40 = ppVar36->base;
                                                sVar37 = ppVar36->off;
                                                (puVar40 + sVar37)[0] = '\0';
                                                (puVar40 + sVar37)[1] = '-';
                                                ppVar36->off = ppVar36->off + 2;
                                                iVar15 = 0;
                                              }
                                              bVar44 = iVar15 != 0;
                                              if (!bVar44) {
                                                iVar15 = ptls_buffer_reserve(ppVar36,2);
                                                if (iVar15 == 0) {
                                                  puVar40 = ppVar36->base;
                                                  sVar37 = ppVar36->off;
                                                  (puVar40 + sVar37)[0] = '\0';
                                                  (puVar40 + sVar37)[1] = '\0';
                                                  ppVar36->off = ppVar36->off + 2;
                                                  iVar15 = 0;
                                                }
                                                bVar44 = true;
                                                if (iVar15 == 0) {
                                                  sVar37 = ppVar36->off;
                                                  iVar15 = ptls_buffer_reserve(ppVar36,1);
                                                  if (iVar15 == 0) {
                                                    ppVar36->base[ppVar36->off] = '\0';
                                                    ppVar36->off = ppVar36->off + 1;
                                                    iVar15 = 0;
                                                  }
                                                  bVar44 = true;
                                                  if (iVar15 == 0) {
                                                    sVar39 = ppVar36->off;
                                                    if ((tls->ctx->field_0x68 & 1) == 0) {
                                                      iVar15 = ptls_buffer_reserve(ppVar36,1);
                                                      if (iVar15 == 0) {
                                                        ppVar36->base[ppVar36->off] = '\0';
                                                        ppVar36->off = ppVar36->off + 1;
                                                        iVar15 = 0;
                                                      }
                                                      if (iVar15 != 0) goto LAB_0010b606;
                                                    }
                                                    iVar15 = ptls_buffer_reserve(ppVar36,1);
                                                    if (iVar15 == 0) {
                                                      ppVar36->base[ppVar36->off] = '\x01';
                                                      ppVar36->off = ppVar36->off + 1;
                                                      iVar15 = 0;
                                                    }
                                                    bVar43 = false;
                                                    if (iVar15 == 0) {
                                                      ppVar36->base[sVar39 - 1] =
                                                           (char)(int)ppVar36->off - (char)sVar39;
                                                      bVar43 = true;
                                                      bVar44 = false;
                                                      iVar15 = 0;
                                                    }
                                                  }
                                                  else {
LAB_0010b606:
                                                    bVar43 = false;
                                                  }
                                                  if (bVar43) {
                                                    uVar25 = ppVar36->off - sVar37;
                                                    lVar29 = 8;
                                                    do {
                                                      ppVar36->base[sVar37 - 2] =
                                                           (uint8_t)(uVar25 >> ((byte)lVar29 & 0x3f)
                                                                    );
                                                      lVar29 = lVar29 + -8;
                                                      sVar37 = sVar37 + 1;
                                                    } while (lVar29 != -8);
                                                    bVar44 = false;
                                                  }
                                                }
                                                if (!bVar44) goto LAB_0010b64d;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                            else {
                              iVar15 = ptls_buffer_reserve(ppVar36,2);
                              if (iVar15 == 0) {
                                puVar40 = ppVar36->base;
                                sVar37 = ppVar36->off;
                                (puVar40 + sVar37)[0] = '\0';
                                (puVar40 + sVar37)[1] = '\x1b';
                                ppVar36->off = ppVar36->off + 2;
                                iVar15 = 0;
                              }
                              bVar44 = iVar15 != 0;
                              if (!bVar44) {
                                iVar15 = ptls_buffer_reserve(ppVar36,2);
                                if (iVar15 == 0) {
                                  puVar40 = ppVar36->base;
                                  sVar37 = ppVar36->off;
                                  (puVar40 + sVar37)[0] = '\0';
                                  (puVar40 + sVar37)[1] = '\0';
                                  ppVar36->off = ppVar36->off + 2;
                                  iVar15 = 0;
                                }
                                bVar44 = true;
                                if (iVar15 == 0) {
                                  sVar37 = ppVar36->off;
                                  iVar15 = ptls_buffer_reserve(ppVar36,1);
                                  if (iVar15 == 0) {
                                    ppVar36->base[ppVar36->off] = '\0';
                                    ppVar36->off = ppVar36->off + 1;
                                    iVar15 = 0;
                                  }
                                  bVar44 = true;
                                  if (iVar15 == 0) {
                                    puVar34 = tls->ctx->decompress_certificate->supported_algorithms
                                    ;
                                    if (*puVar34 == 0xffff) {
                                      __assert_fail("*algo != UINT16_MAX",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                                                  ,0x796,
                                                  "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                                                  );
                                    }
                                    local_d0 = ppVar36->off;
                                    uVar4 = *puVar34;
                                    bVar44 = false;
                                    if (uVar4 == 0xffff) {
                                      bVar43 = true;
                                      iVar15 = 0;
                                    }
                                    else {
                                      do {
                                        puVar34 = puVar34 + 1;
                                        iVar15 = ptls_buffer_reserve(ppVar36,2);
                                        if (iVar15 == 0) {
                                          *(ushort *)(ppVar36->base + ppVar36->off) =
                                               uVar4 << 8 | uVar4 >> 8;
                                          ppVar36->off = ppVar36->off + 2;
                                          iVar15 = 0;
                                        }
                                        bVar43 = iVar15 == 0;
                                        if (!bVar43) {
                                          bVar44 = true;
                                          break;
                                        }
                                        uVar4 = *puVar34;
                                      } while (uVar4 != 0xffff);
                                    }
                                    if (bVar43) {
                                      ppVar36->base[local_d0 - 1] =
                                           (char)(int)ppVar36->off - (char)local_d0;
                                      bVar44 = false;
                                    }
                                  }
                                  if (!bVar44) {
                                    uVar25 = ppVar36->off - sVar37;
                                    lVar29 = 8;
                                    do {
                                      ppVar36->base[sVar37 - 2] =
                                           (uint8_t)(uVar25 >> ((byte)lVar29 & 0x3f));
                                      lVar29 = lVar29 + -8;
                                      sVar37 = sVar37 + 1;
                                    } while (lVar29 != -8);
                                    bVar44 = false;
                                  }
                                }
                                if (!bVar44) goto LAB_0010acc6;
                              }
                            }
                          }
                          else {
                            iVar15 = ptls_buffer_reserve(ppVar36,2);
                            if (iVar15 == 0) {
                              puVar40 = ppVar36->base;
                              sVar37 = ppVar36->off;
                              (puVar40 + sVar37)[0] = '\0';
                              (puVar40 + sVar37)[1] = '\x10';
                              ppVar36->off = ppVar36->off + 2;
                              iVar15 = 0;
                            }
                            bVar44 = iVar15 != 0;
                            if (!bVar44) {
                              iVar15 = ptls_buffer_reserve(ppVar36,2);
                              if (iVar15 == 0) {
                                puVar40 = ppVar36->base;
                                sVar37 = ppVar36->off;
                                (puVar40 + sVar37)[0] = '\0';
                                (puVar40 + sVar37)[1] = '\0';
                                ppVar36->off = ppVar36->off + 2;
                                iVar15 = 0;
                              }
                              bVar44 = true;
                              if (iVar15 == 0) {
                                sVar37 = ppVar36->off;
                                iVar15 = ptls_buffer_reserve(ppVar36,2);
                                if (iVar15 == 0) {
                                  puVar40 = ppVar36->base;
                                  sVar39 = ppVar36->off;
                                  (puVar40 + sVar39)[0] = '\0';
                                  (puVar40 + sVar39)[1] = '\0';
                                  ppVar36->off = ppVar36->off + 2;
                                  iVar15 = 0;
                                }
                                bVar44 = true;
                                if (iVar15 == 0) {
                                  local_d0 = ppVar36->off;
                                  if ((local_e0->field_0).client.negotiated_protocols.count == 0) {
                                    bVar44 = false;
                                    iVar15 = 0;
                                  }
                                  else {
                                    lVar29 = 8;
                                    sVar39 = 0;
                                    do {
                                      iVar15 = ptls_buffer_reserve(ppVar36,1);
                                      if (iVar15 == 0) {
                                        ppVar36->base[ppVar36->off] = '\0';
                                        ppVar36->off = ppVar36->off + 1;
                                        iVar15 = 0;
                                      }
                                      bVar44 = true;
                                      if (iVar15 == 0) {
                                        local_b0 = (char *)ppVar36->off;
                                        ppVar10 = (local_e0->field_0).client.negotiated_protocols.
                                                  list;
                                        iVar15 = ptls_buffer__do_pushv
                                                           (ppVar36,*(void **)((long)ppVar10 +
                                                                              lVar29 + -8),
                                                            *(size_t *)
                                                             ((long)&ppVar10->base + lVar29));
                                        bVar44 = iVar15 != 0;
                                        if (iVar15 == 0) {
                                          local_b0[(long)(ppVar36->base + -1)] =
                                               (char)(int)ppVar36->off - (char)local_b0;
                                          bVar44 = false;
                                        }
                                      }
                                      if (bVar44) goto LAB_0010aa73;
                                      sVar39 = sVar39 + 1;
                                      lVar29 = lVar29 + 0x10;
                                    } while (sVar39 != (local_e0->field_0).client.
                                                       negotiated_protocols.count);
                                    bVar44 = false;
                                  }
LAB_0010aa73:
                                  if (!bVar44) {
                                    uVar25 = ppVar36->off - local_d0;
                                    lVar29 = 8;
                                    do {
                                      ppVar36->base[local_d0 - 2] =
                                           (uint8_t)(uVar25 >> ((byte)lVar29 & 0x3f));
                                      lVar29 = lVar29 + -8;
                                      local_d0 = local_d0 + 1;
                                    } while (lVar29 != -8);
                                    bVar44 = false;
                                  }
                                }
                                if (!bVar44) {
                                  uVar25 = ppVar36->off - sVar37;
                                  lVar29 = 8;
                                  do {
                                    ppVar36->base[sVar37 - 2] =
                                         (uint8_t)(uVar25 >> ((byte)lVar29 & 0x3f));
                                    lVar29 = lVar29 + -8;
                                    sVar37 = sVar37 + 1;
                                  } while (lVar29 != -8);
                                  bVar44 = false;
                                }
                              }
                              if (!bVar44) goto LAB_0010aafd;
                            }
                          }
                        }
                        else {
                          psVar18 = tls->esni;
                          iVar15 = ptls_buffer_reserve(ppVar36,2);
                          if (psVar18 == (st_ptls_esni_secret_t *)0x0) {
                            if (iVar15 == 0) {
                              puVar40 = ppVar36->base;
                              sVar37 = ppVar36->off;
                              (puVar40 + sVar37)[0] = '\0';
                              (puVar40 + sVar37)[1] = '\0';
                              ppVar36->off = ppVar36->off + 2;
                              iVar15 = 0;
                            }
                            bVar44 = iVar15 != 0;
                            if (!bVar44) {
                              iVar15 = ptls_buffer_reserve(ppVar36,2);
                              if (iVar15 == 0) {
                                puVar40 = ppVar36->base;
                                sVar37 = ppVar36->off;
                                (puVar40 + sVar37)[0] = '\0';
                                (puVar40 + sVar37)[1] = '\0';
                                ppVar36->off = ppVar36->off + 2;
                                iVar15 = 0;
                              }
                              if (iVar15 == 0) {
                                sVar37 = ppVar36->off;
                                iVar15 = emit_server_name_extension(ppVar36,tls->server_name);
                                if (iVar15 == 0) {
                                  uVar25 = ppVar36->off - sVar37;
                                  lVar29 = 8;
                                  do {
                                    ppVar36->base[sVar37 - 2] =
                                         (uint8_t)(uVar25 >> ((byte)lVar29 & 0x3f));
                                    lVar29 = lVar29 + -8;
                                    sVar37 = sVar37 + 1;
                                  } while (lVar29 != -8);
                                  goto LAB_0010aa63;
                                }
                              }
                              goto LAB_0010a835;
                            }
                          }
                          else {
                            if (iVar15 == 0) {
                              puVar40 = ppVar36->base;
                              sVar37 = ppVar36->off;
                              (puVar40 + sVar37)[0] = 0xff;
                              (puVar40 + sVar37)[1] = 0xce;
                              ppVar36->off = ppVar36->off + 2;
                              iVar15 = 0;
                            }
                            bVar44 = iVar15 != 0;
                            if (!bVar44) {
                              iVar15 = ptls_buffer_reserve(ppVar36,2);
                              if (iVar15 == 0) {
                                puVar40 = ppVar36->base;
                                sVar37 = ppVar36->off;
                                (puVar40 + sVar37)[0] = '\0';
                                (puVar40 + sVar37)[1] = '\0';
                                ppVar36->off = ppVar36->off + 2;
                                iVar15 = 0;
                              }
                              if (iVar15 == 0) {
                                sVar37 = ppVar36->off;
                                esni_keys.len = (size_t)ppVar21;
                                esni_keys.base = (uint8_t *)tls->server_name;
                                iVar15 = emit_esni_extension(tls->esni,ppVar36,esni_keys,local_b0,
                                                             (size_t)in_R9,
                                                             (size_t)in_stack_fffffffffffffec8);
                                if (iVar15 != 0) goto LAB_0010a835;
                                uVar25 = ppVar36->off - sVar37;
                                lVar29 = 8;
                                do {
                                  ppVar36->base[sVar37 - 2] =
                                       (uint8_t)(uVar25 >> ((byte)lVar29 & 0x3f));
                                  lVar29 = lVar29 + -8;
                                  sVar37 = sVar37 + 1;
                                } while (lVar29 != -8);
LAB_0010aa63:
                                bVar44 = false;
                                bVar43 = true;
                              }
                              else {
LAB_0010a835:
                                bVar44 = true;
                                bVar43 = false;
                              }
                              if (bVar43) goto LAB_0010a844;
                            }
                          }
                        }
                      }
                    }
LAB_0010ad10:
                    emitter = local_d8;
                    if (!bVar44) {
                      sVar37 = ppVar36->off;
                      lVar29 = 8;
                      bVar44 = false;
                      sVar39 = local_a8;
                      do {
                        ppVar36->base[sVar39 - 2] =
                             (uint8_t)(sVar37 - local_a8 >> ((byte)lVar29 & 0x3f));
                        lVar29 = lVar29 + -8;
                        sVar39 = sVar39 + 1;
                      } while (lVar29 != -8);
                    }
                  }
                }
              }
            }
          }
        }
        if (!bVar44) {
          uVar25 = local_c0->off - sVar42;
          lVar29 = 0x10;
          do {
            local_c0->base[sVar42 - 3] = (uint8_t)(uVar25 >> ((byte)lVar29 & 0x3f));
            lVar29 = lVar29 + -8;
            sVar42 = sVar42 + 1;
          } while (lVar29 != -8);
          bVar44 = false;
        }
      }
    }
    if (!bVar44) {
      iVar15 = (*emitter->commit_message)(emitter);
      bVar44 = iVar15 != 0;
    }
  }
  else {
    bVar44 = true;
  }
  if (!bVar44) {
    if (bVar44) {
      return iVar15;
    }
    local_d8 = emitter;
    if (local_f8 != (ptls_buffer_t *)0x0) {
      sVar42 = emitter->buf->off;
      ppVar21 = tls->key_schedule;
      ppVar33 = ppVar21->hashes[0].algo;
      sVar37 = ppVar33->digest_size;
      local_f0 = (ptls_buffer_t *)ppVar33->empty_digest;
      secret.base = ppVar21->secret;
      hash_value.len = sVar37;
      hash_value.base = (uint8_t *)local_f0;
      secret.len = sVar37;
      sStack_e8 = sVar37;
      iVar15 = hkdf_expand_label(ppVar33,local_78,sVar37,secret,"res binder",hash_value,
                                 ppVar21->hkdf_label_prefix);
      if (iVar15 == 0) {
        lVar29 = sVar42 - sVar37;
        sVar42 = lVar29 - 3;
        ppVar21 = tls->key_schedule;
        if (ppVar21->num_hashes != 0) {
          sVar39 = sVar42 - local_c8;
          puVar40 = local_d8->buf->base + local_c8;
          pppVar35 = &ppVar21->hashes[0].ctx;
          sVar37 = 0;
          do {
            (*(*pppVar35)->update)(*pppVar35,puVar40,sVar39);
            sVar37 = sVar37 + 1;
            pppVar35 = pppVar35 + 2;
          } while (sVar37 != ppVar21->num_hashes);
        }
        iVar15 = calc_verify_data(local_d8->buf->base + lVar29,tls->key_schedule,local_78);
        bVar44 = iVar15 == 0;
        local_c8 = sVar42;
      }
      else {
        bVar44 = false;
      }
      if (!bVar44) goto LAB_0010af5a;
    }
    ppVar21 = tls->key_schedule;
    if (ppVar21->num_hashes != 0) {
      puVar40 = local_d8->buf->base + local_c8;
      sVar42 = local_d8->buf->off - local_c8;
      pppVar35 = &ppVar21->hashes[0].ctx;
      sVar37 = 0;
      do {
        (*(*pppVar35)->update)(*pppVar35,puVar40,sVar42);
        sVar37 = sVar37 + 1;
        pppVar35 = pppVar35 + 2;
      } while (sVar37 != ppVar21->num_hashes);
    }
    if (((tls->field_20).server.pending_traffic_secret[0x28] & 2) != 0) {
      if (ppVar5 != (ptls_key_schedule_t *)0x0) {
        __assert_fail("!is_second_flight",
                      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                      ,0x7e2,
                      "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                     );
      }
      iVar15 = setup_traffic_protection(tls,1,"c e traffic",1,0);
      if ((iVar15 != 0) || (iVar15 = push_change_cipher_spec(tls,local_d8->buf), iVar15 != 0))
      goto LAB_0010af5a;
    }
    if ((ppVar5 != (ptls_key_schedule_t *)0x0 || local_f8 == (ptls_buffer_t *)0x0) ||
       (iVar15 = derive_exporter_secret(tls,1), iVar15 == 0)) {
      tls->state = PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO - (local_b8 == (ptls_iovec_t *)0x0);
      iVar15 = 0x202;
    }
  }
LAB_0010af5a:
  (*ptls_clear_memory)(local_78,0x40);
  return iVar15;
}

Assistant:

static int send_client_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_handshake_properties_t *properties,
                             ptls_iovec_t *cookie)
{
    ptls_iovec_t resumption_secret = {NULL}, resumption_ticket;
    uint32_t obfuscated_ticket_age = 0;
    size_t msghash_off;
    uint8_t binder_key[PTLS_MAX_DIGEST_SIZE];
    int ret, is_second_flight = tls->key_schedule != NULL,
             send_sni = tls->server_name != NULL && !ptls_server_name_is_ipaddr(tls->server_name);

    if (properties != NULL) {
        /* try to use ESNI */
        if (!is_second_flight && send_sni && properties->client.esni_keys.base != NULL) {
            if ((ret = client_setup_esni(tls->ctx, &tls->esni, properties->client.esni_keys, tls->client_random)) != 0)
                goto Exit;
            if (tls->ctx->update_esni_key != NULL) {
                if ((ret = tls->ctx->update_esni_key->cb(tls->ctx->update_esni_key, tls, tls->esni->secret,
                                                         tls->esni->client.cipher->hash, tls->esni->esni_contents_hash)) != 0)
                    goto Exit;
            }
        }
        /* setup resumption-related data. If successful, resumption_secret becomes a non-zero value. */
        if (properties->client.session_ticket.base != NULL) {
            ptls_key_exchange_algorithm_t *key_share = NULL;
            ptls_cipher_suite_t *cipher_suite = NULL;
            uint32_t max_early_data_size;
            if (decode_stored_session_ticket(tls, &key_share, &cipher_suite, &resumption_secret, &obfuscated_ticket_age,
                                             &resumption_ticket, &max_early_data_size, properties->client.session_ticket.base,
                                             properties->client.session_ticket.base + properties->client.session_ticket.len) == 0) {
                tls->client.offered_psk = 1;
                /* key-share selected by HRR should not be overridden */
                if (tls->key_share == NULL)
                    tls->key_share = key_share;
                tls->cipher_suite = cipher_suite;
                if (!is_second_flight && max_early_data_size != 0 && properties->client.max_early_data_size != NULL) {
                    tls->client.using_early_data = 1;
                    *properties->client.max_early_data_size = max_early_data_size;
                }
            } else {
                resumption_secret = ptls_iovec_init(NULL, 0);
            }
        }
        if (tls->client.using_early_data) {
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
        } else {
            if (properties->client.max_early_data_size != NULL)
                *properties->client.max_early_data_size = 0;
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_REJECTED;
        }
    }

    /* use the default key share if still not undetermined */
    if (tls->key_share == NULL && !(properties != NULL && properties->client.negotiate_before_key_exchange))
        tls->key_share = tls->ctx->key_exchanges[0];

    if (!is_second_flight) {
        tls->key_schedule = key_schedule_new(tls->cipher_suite, tls->ctx->cipher_suites, tls->ctx->hkdf_label_prefix__obsolete);
        if ((ret = key_schedule_extract(tls->key_schedule, resumption_secret)) != 0)
            goto Exit;
    }

    msghash_off = emitter->buf->off + emitter->record_header_length;
    ptls_push_message(emitter, NULL, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, {
        ptls_buffer_t *sendbuf = emitter->buf;
        /* legacy_version */
        ptls_buffer_push16(sendbuf, 0x0303);
        /* random_bytes */
        ptls_buffer_pushv(sendbuf, tls->client_random, sizeof(tls->client_random));
        /* lecagy_session_id */
        ptls_buffer_push_block(
            sendbuf, 1, { ptls_buffer_pushv(sendbuf, tls->client.legacy_session_id, sizeof(tls->client.legacy_session_id)); });
        /* cipher_suites */
        ptls_buffer_push_block(sendbuf, 2, {
            ptls_cipher_suite_t **cs = tls->ctx->cipher_suites;
            for (; *cs != NULL; ++cs)
                ptls_buffer_push16(sendbuf, (*cs)->id);
        });
        /* legacy_compression_methods */
        ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, 0); });
        /* extensions */
        ptls_buffer_push_block(sendbuf, 2, {
            struct {
                size_t off;
                size_t len;
            } key_share_client_hello;
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_KEY_SHARE, {
                key_share_client_hello.off = sendbuf->off;
                ptls_buffer_push_block(sendbuf, 2, {
                    if (tls->key_share != NULL) {
                        if ((ret = tls->key_share->create(tls->key_share, &tls->client.key_share_ctx)) != 0)
                            goto Exit;
                        if ((ret = push_key_share_entry(sendbuf, tls->key_share->id, tls->client.key_share_ctx->pubkey)) != 0)
                            goto Exit;
                    }
                });
                key_share_client_hello.len = sendbuf->off - key_share_client_hello.off;
            });
            if (send_sni) {
                if (tls->esni != NULL) {
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_SERVER_NAME, {
                        if ((ret = emit_esni_extension(tls->esni, sendbuf, properties->client.esni_keys, tls->server_name,
                                                       key_share_client_hello.off, key_share_client_hello.len)) != 0)
                            goto Exit;
                    });
                } else {
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                        if ((ret = emit_server_name_extension(sendbuf, tls->server_name)) != 0)
                            goto Exit;
                    });
                }
            }
            if (properties != NULL && properties->client.negotiated_protocols.count != 0) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ALPN, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        size_t i;
                        for (i = 0; i != properties->client.negotiated_protocols.count; ++i) {
                            ptls_buffer_push_block(sendbuf, 1, {
                                ptls_iovec_t p = properties->client.negotiated_protocols.list[i];
                                ptls_buffer_pushv(sendbuf, p.base, p.len);
                            });
                        }
                    });
                });
            }
            if (tls->ctx->decompress_certificate != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COMPRESS_CERTIFICATE, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        const uint16_t *algo = tls->ctx->decompress_certificate->supported_algorithms;
                        assert(*algo != UINT16_MAX);
                        for (; *algo != UINT16_MAX; ++algo)
                            ptls_buffer_push16(sendbuf, *algo);
                    });
                });
            }
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS, {
                ptls_buffer_push_block(sendbuf, 1, {
                    size_t i;
                    for (i = 0; i != sizeof(supported_versions) / sizeof(supported_versions[0]); ++i)
                        ptls_buffer_push16(sendbuf, supported_versions[i]);
                });
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS, {
                if ((ret = push_signature_algorithms(sendbuf)) != 0)
                    goto Exit;
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_GROUPS, {
                ptls_key_exchange_algorithm_t **algo = tls->ctx->key_exchanges;
                ptls_buffer_push_block(sendbuf, 2, {
                    for (; *algo != NULL; ++algo)
                        ptls_buffer_push16(sendbuf, (*algo)->id);
                });
            });
            if (cookie != NULL && cookie->base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COOKIE, {
                    ptls_buffer_push_block(sendbuf, 2, { ptls_buffer_pushv(sendbuf, cookie->base, cookie->len); });
                });
            }
            if ((ret = push_additional_extensions(properties, sendbuf)) != 0)
                goto Exit;
            if (tls->ctx->save_ticket != NULL || resumption_secret.base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PSK_KEY_EXCHANGE_MODES, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        if (!tls->ctx->require_dhe_on_psk)
                            ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK);
                        ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK_DHE);
                    });
                });
            }
            if (resumption_secret.base != NULL) {
                if (tls->client.using_early_data && !is_second_flight)
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_EARLY_DATA, {});
                /* pre-shared key "MUST be the last extension in the ClientHello" (draft-17 section 4.2.6) */
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PRE_SHARED_KEY, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 2,
                                               { ptls_buffer_pushv(sendbuf, resumption_ticket.base, resumption_ticket.len); });
                        ptls_buffer_push32(sendbuf, obfuscated_ticket_age);
                    });
                    /* allocate space for PSK binder. the space is filled at the bottom of the function */
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 1, {
                            if ((ret = ptls_buffer_reserve(sendbuf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
                                goto Exit;
                            sendbuf->off += tls->key_schedule->hashes[0].algo->digest_size;
                        });
                    });
                });
            }
        });
    });

    /* update the message hash, filling in the PSK binder HMAC if necessary */
    if (resumption_secret.base != NULL) {
        size_t psk_binder_off = emitter->buf->off - (3 + tls->key_schedule->hashes[0].algo->digest_size);
        if ((ret = derive_secret_with_empty_digest(tls->key_schedule, binder_key, "res binder")) != 0)
            goto Exit;
        ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, psk_binder_off - msghash_off);
        msghash_off = psk_binder_off;
        if ((ret = calc_verify_data(emitter->buf->base + psk_binder_off + 3, tls->key_schedule, binder_key)) != 0)
            goto Exit;
    }
    ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, emitter->buf->off - msghash_off);

    if (tls->client.using_early_data) {
        assert(!is_second_flight);
        if ((ret = setup_traffic_protection(tls, 1, "c e traffic", 1, 0)) != 0)
            goto Exit;
        if ((ret = push_change_cipher_spec(tls, emitter->buf)) != 0)
            goto Exit;
    }
    if (resumption_secret.base != NULL && !is_second_flight) {
        if ((ret = derive_exporter_secret(tls, 1)) != 0)
            goto Exit;
    }
    tls->state = cookie == NULL ? PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO : PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    ptls_clear_memory(binder_key, sizeof(binder_key));
    return ret;
}